

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitStringEncode(BinaryInstWriter *this,StringEncode *curr)

{
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  int __fd;
  LEB<unsigned_int,_unsigned_char> *this_00;
  LEB<unsigned_int,_unsigned_char> local_24;
  LEB<unsigned_int,_unsigned_char> local_20;
  uchar local_1a [2];
  
  bVar1 = wasm::Type::isNull(&curr->str->type);
  if (bVar1) {
    local_1a[1] = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_1a + 1);
  }
  else {
    local_1a[0] = 0xfb;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_1a);
    if (curr->op == StringEncodeWTF16Array) {
      __fd = (int)this->o;
      this_00 = &local_24;
      local_24.value = 0xb3;
    }
    else {
      if (curr->op != StringEncodeLossyUTF8Array) {
        handle_unreachable("invalid string.new*",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0xa20);
      }
      __fd = (int)this->o;
      this_00 = &local_20;
      local_20.value = 0xb6;
    }
    LEB<unsigned_int,_unsigned_char>::write(this_00,__fd,__buf,in_RCX);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitStringEncode(StringEncode* curr) {
  if (curr->str->type.isNull()) {
    // See visitStringNew.
    emitUnreachable();
    return;
  }
  o << int8_t(BinaryConsts::GCPrefix);
  switch (curr->op) {
    case StringEncodeLossyUTF8Array:
      o << U32LEB(BinaryConsts::StringEncodeLossyUTF8Array);
      break;
    case StringEncodeWTF16Array:
      o << U32LEB(BinaryConsts::StringEncodeWTF16Array);
      break;
    default:
      WASM_UNREACHABLE("invalid string.new*");
  }
}